

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

void stack_init(lua_State *L1,lua_State *L)

{
  ulong uVar1;
  StkId pTVar2;
  long lVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  
  pTVar2 = (StkId)luaM_realloc_(L,(void *)0x0,0,0x280);
  auVar4 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar5 = vpbroadcastq_avx512f(ZEXT816(0x28));
  auVar6 = vpbroadcastq_avx512f(ZEXT816(8));
  lVar3 = 0x78;
  L1->stack = pTVar2;
  L1->stacksize = 0x28;
  do {
    uVar1 = vpcmpuq_avx512f(auVar4,auVar5,1);
    if ((uVar1 & 1) != 0) {
      *(undefined2 *)((long)&pTVar2[-7].value_ + lVar3) = 0;
    }
    if ((uVar1 & 2) != 0) {
      *(undefined2 *)((long)&pTVar2[-6].value_ + lVar3) = 0;
    }
    if ((uVar1 & 4) != 0) {
      *(undefined2 *)((long)&pTVar2[-5].value_ + lVar3) = 0;
    }
    if ((uVar1 & 8) != 0) {
      *(undefined2 *)((long)&pTVar2[-4].value_ + lVar3) = 0;
    }
    if ((uVar1 & 0x10) != 0) {
      *(undefined2 *)((long)&pTVar2[-3].value_ + lVar3) = 0;
    }
    if ((uVar1 & 0x20) != 0) {
      *(undefined2 *)((long)&pTVar2[-2].value_ + lVar3) = 0;
    }
    if ((uVar1 & 0x40) != 0) {
      *(undefined2 *)((long)&pTVar2[-1].value_ + lVar3) = 0;
    }
    if ((uVar1 & 0x80) != 0) {
      *(undefined2 *)((long)&pTVar2->value_ + lVar3) = 0;
    }
    auVar4 = vpaddq_avx512f(auVar4,auVar6);
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x2f8);
  L1->stack_last = pTVar2 + 0x23;
  (L1->base_ci).callstatus = 0;
  (L1->base_ci).jitstatus = '\0';
  (L1->base_ci).magic = '*';
  (L1->base_ci).previous = (CallInfo *)0x0;
  (L1->base_ci).next = (CallInfo *)0x0;
  (L1->base_ci).func = pTVar2;
  L1->top = pTVar2 + 1;
  pTVar2->tt_ = 0;
  (L1->base_ci).top = pTVar2 + 0x15;
  L1->ci = &L1->base_ci;
  return;
}

Assistant:

static void stack_init (lua_State *L1, lua_State *L) {
  int i; CallInfo *ci;
  /* initialize stack array */
  L1->stack = luaM_newvector(L, BASIC_STACK_SIZE, TValue);
  L1->stacksize = BASIC_STACK_SIZE;
  for (i = 0; i < BASIC_STACK_SIZE; i++)
    setnilvalue(L1->stack + i);  /* erase new stack */
  L1->top = L1->stack;
  L1->stack_last = L1->stack + L1->stacksize - EXTRA_STACK;
  /* initialize first ci */
  ci = &L1->base_ci;
  ci->next = ci->previous = NULL;
  ci->callstatus = 0;
  ci->jitstatus = 0; /* RAVI extension */
  ci->magic = 42; /* RAVI extension */
  ci->func = L1->top;
  setnilvalue(L1->top++);  /* 'function' entry for this 'ci' */
  ci->top = L1->top + LUA_MINSTACK;
  L1->ci = ci;
}